

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

string * __thiscall
Catch::Matchers::StringMatcherBase::describe_abi_cxx11_
          (string *__return_storage_ptr__,StringMatcherBase *this)

{
  char *pcVar1;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  std::__cxx11::string::append((char *)__return_storage_ptr__,(ulong)(this->m_operation).m_start);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::push_back((char)__return_storage_ptr__);
  pcVar1 = " (case insensitive)";
  if ((this->m_comparator).m_caseSensitivity == Yes) {
    pcVar1 = "";
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__,(ulong)pcVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string StringMatcherBase::describe() const {
        std::string description;
        description.reserve(5 + m_operation.size() + m_comparator.m_str.size() +
                                    m_comparator.caseSensitivitySuffix().size());
        description += m_operation;
        description += ": \"";
        description += m_comparator.m_str;
        description += '"';
        description += m_comparator.caseSensitivitySuffix();
        return description;
    }